

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,_QFileInfo>_>::erase
          (QMovableArrayOps<std::pair<QString,_QFileInfo>_> *this,pair<QString,_QFileInfo> *b,
          qsizetype n)

{
  pair<QString,_QFileInfo> *ppVar1;
  long lVar2;
  pair<QString,_QFileInfo> *ppVar3;
  pair<QString,_QFileInfo> *__last;
  
  __last = b + n;
  std::_Destroy_aux<false>::__destroy<std::pair<QString,QFileInfo>*>(b,__last);
  ppVar1 = (this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
           super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.ptr;
  lVar2 = (this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
          super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.size;
  ppVar3 = ppVar1 + lVar2;
  if (__last == ppVar3 || ppVar1 != b) {
    if (__last != ppVar3) {
      memmove(b,__last,(long)ppVar3 - (long)__last);
      lVar2 = (this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
              super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.size;
    }
  }
  else {
    (this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
    super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.ptr = __last;
  }
  (this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
  super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.size = lVar2 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }